

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O3

QJsonValue * QJsonValue::fromVariant(QJsonValue *__return_storage_ptr__,QVariant *variant)

{
  PrivateShared *pPVar1;
  bool bVar2;
  int iVar3;
  QMetaType QVar4;
  qlonglong v;
  qulonglong qVar5;
  long in_FS_OFFSET;
  double v_00;
  QJsonDocument doc;
  QCborMap local_58;
  QJsonArray local_50;
  undefined1 local_48 [24];
  anon_union_24_3_e3d07ef4_for_data local_30;
  
  local_30._16_8_ = *(long *)(in_FS_OFFSET + 0x28);
  QVar4 = ::QVariant::metaType(variant);
  if (QVar4.d_ptr == (QMetaTypeInterface *)0x0) {
switchD_002f5db6_caseD_7:
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toString((QString *)local_48,variant);
    if ((undefined1 *)local_48._16_8_ == (undefined1 *)0x0) {
      QJsonValue(__return_storage_ptr__,Null);
    }
    else {
      QJsonValue(__return_storage_ptr__,(QString *)local_48);
    }
    goto LAB_002f5e32;
  }
  iVar3 = ((QVar4.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
  if (iVar3 == 0) {
    iVar3 = QMetaType::registerHelper(QVar4.d_ptr);
  }
  switch(iVar3) {
  case 1:
    bVar2 = ::QVariant::toBool(variant);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30._16_8_) {
      QJsonValue(__return_storage_ptr__,bVar2);
      return __return_storage_ptr__;
    }
    goto LAB_002f6596;
  case 2:
  case 3:
  case 4:
  case 0x20:
  case 0x21:
  case 0x24:
    goto switchD_002f5db6_caseD_2;
  case 5:
  case 0x23:
    qVar5 = ::QVariant::toULongLong(variant,(bool *)0x0);
    if ((long)qVar5 < 0) goto switchD_002f5db6_caseD_6;
    goto switchD_002f5db6_caseD_2;
  case 6:
  case 0x26:
  case 0x3f:
switchD_002f5db6_caseD_6:
    v_00 = ::QVariant::toDouble(variant,(bool *)0x0);
    if ((ulong)ABS(v_00) < 0x7ff0000000000000) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30._16_8_) {
        QJsonValue(__return_storage_ptr__,v_00);
        return __return_storage_ptr__;
      }
      goto LAB_002f6596;
    }
  case 0x33:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30._16_8_) {
      QJsonValue(__return_storage_ptr__,Null);
      return __return_storage_ptr__;
    }
    goto LAB_002f6596;
  default:
    goto switchD_002f5db6_caseD_7;
  case 8:
    ::QVariant::toMap((QVariant *)&local_30);
    QJsonObject::fromVariantMap((QJsonObject *)local_48,(QVariantMap *)&local_30);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)local_48);
    QJsonObject::~QJsonObject((QJsonObject *)local_48);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                *)&local_30);
    break;
  case 9:
    ::QVariant::toList((QVariantList *)local_48,variant);
    QJsonArray::fromVariantList((QJsonArray *)&local_30,(QVariantList *)local_48);
    QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_30);
    QJsonArray::~QJsonArray((QJsonArray *)&local_30);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_48);
    break;
  case 10:
    ::QVariant::toString((QString *)local_48,variant);
    QJsonValue(__return_storage_ptr__,(QString *)local_48);
    goto LAB_002f5e32;
  case 0xb:
    ::QVariant::toStringList((QStringList *)local_48,variant);
    QJsonArray::fromStringList((QJsonArray *)&local_30,(QStringList *)local_48);
    QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_30);
    QJsonArray::~QJsonArray((QJsonArray *)&local_30);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_48);
    break;
  case 0x11:
    ::QVariant::toUrl((QVariant *)&local_30);
    QUrl::toString((QString *)local_48,(QUrl *)&local_30,(FormattingOptions)0x1f00000);
    QJsonValue(__return_storage_ptr__,(QString *)local_48);
    if ((QMetaTypeInterface *)local_48._0_8_ != (QMetaTypeInterface *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48._0_8_,2,0x10);
      }
    }
    QUrl::~QUrl((QUrl *)&local_30);
    break;
  case 0x1c:
    ::QVariant::toHash((QVariant *)&local_30);
    QJsonObject::fromVariantHash((QJsonObject *)local_48,(QVariantHash *)&local_30);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)local_48);
    QJsonObject::~QJsonObject((QJsonObject *)local_48);
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&local_30);
    break;
  case 0x1e:
    local_30._0_16_ = (undefined1  [16])::QVariant::toUuid(variant);
    QUuid::toString((QString *)local_48,(QUuid *)&local_30,WithoutBraces);
    QJsonValue(__return_storage_ptr__,(QString *)local_48);
LAB_002f5e32:
    if ((QMetaTypeInterface *)local_48._0_8_ != (QMetaTypeInterface *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48._0_8_,2,0x10);
      }
    }
    break;
  case 0x2d:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30._16_8_) {
      ::QVariant::toJsonValue(__return_storage_ptr__,variant);
      return __return_storage_ptr__;
    }
    goto LAB_002f6596;
  case 0x2e:
    ::QVariant::toJsonObject((QVariant *)local_48);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)local_48);
    QJsonObject::~QJsonObject((QJsonObject *)local_48);
    break;
  case 0x2f:
    ::QVariant::toJsonArray((QVariant *)local_48);
    QJsonValue(__return_storage_ptr__,(QJsonArray *)local_48);
    QJsonArray::~QJsonArray((QJsonArray *)local_48);
    break;
  case 0x30:
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toJsonDocument((QVariant *)local_48);
    bVar2 = QJsonDocument::isArray((QJsonDocument *)local_48);
    if (bVar2) {
      QJsonDocument::array((QJsonDocument *)&local_30);
      QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_30);
      QJsonArray::~QJsonArray((QJsonArray *)&local_30);
    }
    else {
      QJsonDocument::object((QJsonDocument *)&local_30);
      QJsonValue(__return_storage_ptr__,(QJsonObject *)&local_30);
      QJsonObject::~QJsonObject((QJsonObject *)&local_30);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)local_48);
    break;
  case 0x35:
    local_30.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QCborValue>::metaType;
    local_50.a.d.ptr =
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (*(ulong *)&(variant->d).field_0x18 & 0xfffffffffffffffc);
    bVar2 = ::comparesEqual((QMetaType *)&local_50,(QMetaType *)&local_30);
    if (bVar2) {
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QCborValue::QCborValue((QCborValue *)local_48,(QCborValue *)variant);
    }
    else {
      local_48._16_8_ = (undefined1 *)0xaaaaaaaa00000117;
      local_48._0_16_ = (undefined1  [16])0x0;
      QVar4 = ::QVariant::metaType(variant);
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QMetaType::convert(QVar4,variant,(QMetaType)local_30.shared,local_48);
    }
    QCborValue::toJsonValue(__return_storage_ptr__,(QCborValue *)local_48);
    QCborValue::~QCborValue((QCborValue *)local_48);
    break;
  case 0x36:
    local_48._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QCborArray>::metaType;
    local_30.shared = (PrivateShared *)(*(ulong *)&(variant->d).field_0x18 & 0xfffffffffffffffc);
    bVar2 = ::comparesEqual((QMetaType *)&local_30,(QMetaType *)local_48);
    if (bVar2) {
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QCborArray::QCborArray((QCborArray *)&local_58,(QCborArray *)variant);
    }
    else {
      local_58.d.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QCborArray::QCborArray((QCborArray *)&local_58);
      QVar4 = ::QVariant::metaType(variant);
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QMetaType::convert(QVar4,variant,(QMetaType)local_48._0_8_,&local_58);
    }
    QCborArray::toJsonArray((QCborArray *)&local_50);
    QJsonValue(__return_storage_ptr__,&local_50);
    QJsonArray::~QJsonArray(&local_50);
    QCborArray::~QCborArray((QCborArray *)&local_58);
    break;
  case 0x37:
    local_48._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QCborMap>::metaType;
    local_30.shared = (PrivateShared *)(*(ulong *)&(variant->d).field_0x18 & 0xfffffffffffffffc);
    bVar2 = ::comparesEqual((QMetaType *)&local_30,(QMetaType *)local_48);
    if (bVar2) {
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QCborMap::QCborMap(&local_58,(QCborMap *)variant);
    }
    else {
      local_58.d.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QCborMap::QCborMap(&local_58);
      QVar4 = ::QVariant::metaType(variant);
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QMetaType::convert(QVar4,variant,(QMetaType)local_48._0_8_,&local_58);
    }
    QCborMap::toJsonObject((QCborMap *)&local_50);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)&local_50);
    QJsonObject::~QJsonObject((QJsonObject *)&local_50);
    QCborMap::~QCborMap(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30._16_8_) {
    return __return_storage_ptr__;
  }
LAB_002f6596:
  __stack_chk_fail();
switchD_002f5db6_caseD_2:
  v = ::QVariant::toLongLong(variant,(bool *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30._16_8_) {
    QJsonValue(__return_storage_ptr__,v);
    return __return_storage_ptr__;
  }
  goto LAB_002f6596;
}

Assistant:

QJsonValue QJsonValue::fromVariant(const QVariant &variant)
{
    switch (variant.metaType().id()) {
    case QMetaType::Nullptr:
        return QJsonValue(Null);
    case QMetaType::Bool:
        return QJsonValue(variant.toBool());
    case QMetaType::Short:
    case QMetaType::UShort:
    case QMetaType::Int:
    case QMetaType::UInt:
    case QMetaType::Long:
    case QMetaType::LongLong:
        return QJsonValue(variant.toLongLong());
    case QMetaType::ULong:
    case QMetaType::ULongLong:
        if (variant.toULongLong() <= static_cast<uint64_t>(std::numeric_limits<qint64>::max()))
            return QJsonValue(variant.toLongLong());
        Q_FALLTHROUGH();
    case QMetaType::Float16:
    case QMetaType::Float:
    case QMetaType::Double: {
        double v = variant.toDouble();
        return qt_is_finite(v) ? QJsonValue(v) : QJsonValue();
    }
    case QMetaType::QString:
        return QJsonValue(variant.toString());
    case QMetaType::QStringList:
        return QJsonValue(QJsonArray::fromStringList(variant.toStringList()));
    case QMetaType::QVariantList:
        return QJsonValue(QJsonArray::fromVariantList(variant.toList()));
    case QMetaType::QVariantMap:
        return QJsonValue(QJsonObject::fromVariantMap(variant.toMap()));
    case QMetaType::QVariantHash:
        return QJsonValue(QJsonObject::fromVariantHash(variant.toHash()));
#ifndef QT_BOOTSTRAPPED
    case QMetaType::QUrl:
        return QJsonValue(variant.toUrl().toString(QUrl::FullyEncoded));
    case QMetaType::QUuid:
        return variant.toUuid().toString(QUuid::WithoutBraces);
    case QMetaType::QJsonValue:
        return variant.toJsonValue();
    case QMetaType::QJsonObject:
        return variant.toJsonObject();
    case QMetaType::QJsonArray:
        return variant.toJsonArray();
    case QMetaType::QJsonDocument: {
        QJsonDocument doc = variant.toJsonDocument();
        return doc.isArray() ? QJsonValue(doc.array()) : QJsonValue(doc.object());
    }
    case QMetaType::QCborValue:
        return qvariant_cast<QCborValue>(variant).toJsonValue();
    case QMetaType::QCborArray:
        return qvariant_cast<QCborArray>(variant).toJsonArray();
    case QMetaType::QCborMap:
        return qvariant_cast<QCborMap>(variant).toJsonObject();
#endif
    default:
        break;
    }
    QString string = variant.toString();
    if (string.isEmpty())
        return QJsonValue();
    return QJsonValue(string);
}